

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_lib.c
# Opt level: O3

int mk_config_set(mk_ctx_t *ctx,...)

{
  char in_AL;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined8 in_RCX;
  void **ppvVar4;
  void **ppvVar5;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  void **local_e0;
  void *local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e0 = &va[0].overflow_arg_area;
  uVar1 = 8;
  local_c8[1] = (void *)in_RSI;
  local_c8[2] = (void *)in_RDX;
  local_c8[3] = (void *)in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  while( true ) {
    uVar3 = (ulong)uVar1;
    if (uVar3 < 0x29) {
      ppvVar4 = (void **)((long)local_c8 + uVar3);
      uVar1 = uVar1 + 8;
      uVar3 = (ulong)uVar1;
    }
    else {
      ppvVar4 = local_e0;
      local_e0 = local_e0 + 1;
    }
    if ((char *)*ppvVar4 == (char *)0x0) {
      return 0;
    }
    if ((uint)uVar3 < 0x29) {
      uVar1 = (uint)uVar3 + 8;
      ppvVar5 = (void **)((long)local_c8 + uVar3);
    }
    else {
      ppvVar5 = local_e0;
      local_e0 = local_e0 + 1;
    }
    if ((char *)*ppvVar5 == (char *)0x0) break;
    iVar2 = mk_config_set_property(ctx->server,(char *)*ppvVar4,(char *)*ppvVar5);
    if (iVar2 != 0) {
      return -1;
    }
  }
  return -1;
}

Assistant:

int mk_config_set(mk_ctx_t *ctx, ...)
{
    int ret;
    char *key;
    char *value;
    va_list va;

    va_start(va, ctx);

    while ((key = va_arg(va, char *))) {
        value = va_arg(va, char *);
        if (!value) {
            /* Wrong parameter */
            va_end(va);
            return -1;
        }

        ret = mk_config_set_property(ctx->server, key, value);
        if (ret != 0) {
            va_end(va);
            return -1;
        }
    }

    va_end(va);
    return 0;
}